

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelTests.cpp
# Opt level: O2

void __thiscall
ModelTestFixture_testFindById_Test::TestBody(ModelTestFixture_testFindById_Test *this)

{
  Mock *rhs;
  char *message;
  AssertHelper AStack_48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertionResult gtest_ar;
  Mock object;
  
  object.super_Model<Mock>._vptr_Model = (_func_int **)0x0;
  object.super_Model<Mock>.id = 0;
  object.super_Model<Mock>._12_4_ = 0;
  Mock::Mock((Mock *)&object.super_Model<Mock>);
  Model<Mock>::save(&object.super_Model<Mock>);
  rhs = Model<Mock>::findById(0);
  testing::internal::CmpHelperEQ<Mock,Mock>
            ((internal *)&gtest_ar,"object","*Mock::findById(object.getId())",
             (Mock *)&object.super_Model<Mock>,rhs);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ajatprabha[P]CS223_Apr18_02/tests/base_tests/ModelTests.cpp"
               ,0x2e,message);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ModelTestFixture, testFindById) {
    Mock object = Mock();
    object.save();
    ASSERT_EQ(object, *Mock::findById(object.getId()));
}